

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::BinaryToHex(string *__return_storage_ptr__,string *src)

{
  undefined8 uVar1;
  ulong uVar2;
  char *pcVar3;
  uchar *puVar4;
  uchar *local_50;
  char *append_ptr;
  uchar auStack_38 [8];
  uchar symbol [16];
  size_t i;
  string *src_local;
  string *dest;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  builtin_memcpy(auStack_38,"01234567",8);
  builtin_memcpy(symbol,"89abcdef",8);
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  local_50 = (uchar *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  symbol[8] = '\0';
  symbol[9] = '\0';
  symbol[10] = '\0';
  symbol[0xb] = '\0';
  symbol[0xc] = '\0';
  symbol[0xd] = '\0';
  symbol[0xe] = '\0';
  symbol[0xf] = '\0';
  for (; uVar1 = symbol._8_8_, uVar2 = std::__cxx11::string::size(), (ulong)uVar1 < uVar2;
      symbol._8_8_ = symbol._8_8_ + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)src);
    puVar4 = local_50 + 1;
    *local_50 = symbol[(long)((int)((int)*pcVar3 & 0xf0U) >> 4) + -8];
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)src);
    local_50 = local_50 + 2;
    *puVar4 = symbol[(long)(int)((int)*pcVar3 & 0xf) + -8];
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryToHex(const string& src) {
  string dest;
  size_t i;
  unsigned char symbol[16] = {
    '0', '1', '2', '3',
    '4', '5', '6', '7',
    '8', '9', 'a', 'b',
    'c', 'd', 'e', 'f',
  };

  dest.resize(src.size() * 2);
  char* append_ptr = &dest[0];

  for (i = 0; i < src.size(); i++) {
    *append_ptr++ = symbol[(src[i] & 0xf0) >> 4];
    *append_ptr++ = symbol[src[i] & 0x0f];
  }

  return dest;
}